

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDeclsCtx::addElem
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *this,Name name,TableIdxT *param_2
          ,optional<wasm::Ok> param_3,ElemListT *param_4,Index pos)

{
  int __val;
  Name root;
  Name name_;
  Name name_00;
  bool bVar1;
  ElementSegment *pEVar2;
  pointer pEVar3;
  size_type sVar4;
  char *pcVar5;
  Ok local_149;
  value_type local_148;
  size_t local_118;
  char *pcStack_110;
  string_view local_108;
  string local_f8;
  Name local_d8;
  size_t local_c8;
  char *pcStack_c0;
  undefined4 local_b0;
  allocator<char> local_a9;
  string local_a8;
  Err local_88;
  size_t local_68;
  char *pcStack_60;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> local_40;
  __single_object e;
  TableIdxT *param_2_local;
  ParseDeclsCtx *this_local;
  undefined1 auStack_20 [6];
  optional<wasm::Ok> param_3_local;
  Name name_local;
  
  pcVar5 = name.super_IString.str._M_str;
  _auStack_20 = name.super_IString.str._M_len;
  e._M_t.super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
  _M_t.super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
  super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
       )(__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
         )param_2;
  std::make_unique<wasm::ElementSegment>();
  bVar1 = IString::operator_cast_to_bool((IString *)auStack_20);
  if (bVar1) {
    local_68 = _auStack_20;
    name_00.super_IString.str._M_str = pcVar5;
    name_00.super_IString.str._M_len = _auStack_20;
    pcStack_60 = pcVar5;
    pEVar2 = Module::getElementSegmentOrNull(this->wasm,name_00);
    if (pEVar2 != (ElementSegment *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"repeated element segment name",&local_a9);
      Lexer::err(&local_88,&this->in,(ulong)pos,&local_a8);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_88);
      wasm::Err::~Err(&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
      goto LAB_02311a3e;
    }
    pEVar3 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
             operator->(&local_40);
    local_c8 = _auStack_20;
    name_.super_IString.str._M_str = pcVar5;
    name_.super_IString.str._M_len = _auStack_20;
    pcStack_c0 = pcVar5;
    Named::setExplicitName(&pEVar3->super_Named,name_);
  }
  else {
    __val = this->elemCounter;
    this->elemCounter = __val + 1;
    std::__cxx11::to_string(&local_f8,__val);
    wasm::Name::Name(&local_d8,&local_f8);
    wasm::Name::operator=((Name *)auStack_20,&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    local_118 = _auStack_20;
    root.super_IString.str._M_str = pcVar5;
    root.super_IString.str._M_len = _auStack_20;
    pcStack_110 = pcVar5;
    local_108 = (string_view)Names::getValidElementSegmentName(this->wasm,root);
    wasm::Name::operator=((Name *)auStack_20,(Name *)&local_108);
    pEVar3 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
             operator->(&local_40);
    wasm::Name::operator=((Name *)pEVar3,(Name *)auStack_20);
  }
  local_148.name.super_IString.str._M_len = _auStack_20;
  local_148.pos = pos;
  local_148.name.super_IString.str._M_str = pcVar5;
  sVar4 = std::
          vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
          ::size(&this->wasm->elementSegments);
  local_148.index = (Index)sVar4;
  local_148.annotations.
  super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.annotations.
  super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.annotations.
  super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::vector
            (&local_148.annotations);
  std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::push_back
            (&this->elemDefs,&local_148);
  DefPos::~DefPos(&local_148);
  Module::addElementSegment(this->wasm,&local_40);
  Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_149);
LAB_02311a3e:
  local_b0 = 1;
  std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::~unique_ptr
            (&local_40);
  return __return_storage_ptr__;
}

Assistant:

Result<> ParseDeclsCtx::addElem(
  Name name, TableIdxT*, std::optional<ExprT>, ElemListT&&, Index pos) {
  auto e = std::make_unique<ElementSegment>();
  if (name) {
    if (wasm.getElementSegmentOrNull(name)) {
      // TDOO: if the existing segment is not explicitly named, fix its name and
      // continue.
      return in.err(pos, "repeated element segment name");
    }
    e->setExplicitName(name);
  } else {
    name = std::to_string(elemCounter++);
    name = Names::getValidElementSegmentName(wasm, name);
    e->name = name;
  }
  // TODO: element segment annotations
  elemDefs.push_back({name, pos, Index(wasm.elementSegments.size()), {}});
  wasm.addElementSegment(std::move(e));
  return Ok{};
}